

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hlcv.c
# Opt level: O1

ErrorNumber test_func_per_hlcv(TA_History *history)

{
  double dVar1;
  TA_TestId TVar2;
  TA_RetCode TVar3;
  ErrorNumber EVar4;
  ulong uVar5;
  int iVar6;
  TA_FuncUnstId unstId;
  int iVar7;
  uint integerTolerance;
  TA_Real *pTVar8;
  TA_Test_conflict8 *pTVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict8 *local_58;
  TA_Real *local_50;
  TA_Real *pTStack_48;
  TA_Real *local_40;
  TA_Real *pTStack_38;
  
  pTVar9 = tableTest;
  uVar10 = 0;
  do {
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    if ((int)history->nbBars < pTVar9->expectedNbElement) {
      printf("Failed Bad Parameter for Test #%d (%d,%d)\n",uVar10 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    TVar3 = TA_SetUnstablePeriod(TA_FUNC_UNST_MFI,0);
    uVar5 = 0x8a;
    if (TVar3 != TA_SUCCESS) goto LAB_001197f1;
    switch(pTVar9->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar9->optInTimePeriod,&outBegIdx,&outNbElement,
                     gBuffer[0].out0);
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_00119771;
    case TA_ADOSC_5_2_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_00119771:
      TVar3 = TA_ADOSC(iVar7,iVar6,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar8,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    default:
      TVar3 = 0x140d;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar4 != TA_TEST_PASS))
       || (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
          EVar4 != TA_TEST_PASS)) goto LAB_001197ef;
    EVar4 = checkExpectedValue(gBuffer[0].out0,TVar3,pTVar9->expectedRetCode,outBegIdx,
                               pTVar9->expectedBegIdx,outNbElement,pTVar9->expectedNbElement,
                               pTVar9->oneOfTheExpectedOutReal0,
                               pTVar9->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119852;
    outNbElement = 0;
    outBegIdx = 0;
    switch(pTVar9->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar9->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in)
      ;
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_00119928;
    case TA_ADOSC_5_2_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_00119928:
      TVar3 = TA_ADOSC(iVar7,iVar6,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar8,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    default:
      TVar3 = 0x140e;
    }
    EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars), EVar4 != TA_TEST_PASS)
        ) || (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[0].in), EVar4 != TA_TEST_PASS))
    goto LAB_001197ef;
    EVar4 = checkExpectedValue(gBuffer[0].in,TVar3,pTVar9->expectedRetCode,outBegIdx,
                               pTVar9->expectedBegIdx,outNbElement,pTVar9->expectedNbElement,
                               pTVar9->oneOfTheExpectedOutReal0,
                               pTVar9->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119852;
    setInputBuffer(0,history->high,history->nbBars);
    switch(pTVar9->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar9->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[1].in)
      ;
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_00119abc;
    case TA_ADOSC_5_2_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_00119abc:
      TVar3 = TA_ADOSC(iVar7,iVar6,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar8,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    default:
      TVar3 = 0x140f;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars), EVar4 != TA_TEST_PASS)
        ) || (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[1].in), EVar4 != TA_TEST_PASS))
    goto LAB_001197ef;
    EVar4 = checkExpectedValue(gBuffer[1].in,TVar3,pTVar9->expectedRetCode,outBegIdx,
                               pTVar9->expectedBegIdx,outNbElement,pTVar9->expectedNbElement,
                               pTVar9->oneOfTheExpectedOutReal0,
                               pTVar9->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119852;
    setInputBuffer(1,history->low,history->nbBars);
    switch(pTVar9->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar9->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[2].in)
      ;
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[2].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_00119c56;
    case TA_ADOSC_5_2_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_00119c56:
      TVar3 = TA_ADOSC(iVar7,iVar6,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar8,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[2].in);
      break;
    default:
      TVar3 = 0x1410;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 == TA_TEST_PASS) &&
        (EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar4 == TA_TEST_PASS))
       && (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[2].in), EVar4 == TA_TEST_PASS)) {
      EVar4 = checkExpectedValue(gBuffer[2].in,TVar3,pTVar9->expectedRetCode,outBegIdx,
                                 pTVar9->expectedBegIdx,outNbElement,pTVar9->expectedNbElement,
                                 pTVar9->oneOfTheExpectedOutReal0,
                                 pTVar9->oneOfTheExpectedOutRealIndex0);
      if (EVar4 == TA_TEST_PASS) {
        setInputBuffer(2,history->close,history->nbBars);
        if (pTVar9->doRangeTestFlag != 0) {
          local_50 = history->high;
          pTStack_48 = history->low;
          local_40 = history->close;
          pTStack_38 = history->volume;
          TVar2 = pTVar9->theFunction;
          local_58 = pTVar9;
          if (TVar2 - TA_ADOSC_3_10_TEST < 2) {
            unstId = TA_FUNC_UNST_EMA;
LAB_00119da5:
            integerTolerance = 0xffffffff;
          }
          else {
            if (TVar2 == TA_AD_TEST) {
              unstId = TA_FUNC_UNST_NONE;
              goto LAB_00119da5;
            }
            if (TVar2 != TA_ANY_MA_TEST) goto LAB_00119dc2;
            unstId = TA_FUNC_UNST_MFI;
            integerTolerance = 0;
          }
          EVar4 = doRangeTest(rangeTestFunction,unstId,&local_58,1,integerTolerance);
          if (EVar4 != TA_TEST_PASS) goto LAB_001197ef;
        }
LAB_00119dc2:
        pTVar8 = gBuffer[0].out0;
        uVar5 = 0;
        if (pTVar9->theFunction == TA_AD_TEST) {
          *gBuffer[0].out0 = -1.0;
          pTVar8[1] = -1.0;
          TVar3 = TA_AD(0,0,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,history->volume,&outBegIdx,
                        &outNbElement,pTVar8);
          if (TVar3 == TA_SUCCESS) {
            if ((*gBuffer[0].out0 != -1.0) || (NAN(*gBuffer[0].out0))) {
              TVar3 = TA_AD(1,1,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,history->volume,&outBegIdx
                            ,&outNbElement,gBuffer[0].out0 + 1);
              if (TVar3 == TA_SUCCESS) {
                dVar1 = gBuffer[0].out0[1];
                if ((dVar1 != -1.0) || (NAN(dVar1))) {
                  if ((dVar1 == *gBuffer[0].out0) &&
                     (uVar5 = 0, !NAN(dVar1) && !NAN(*gBuffer[0].out0))) {
                    puts("Failed AD logic for fix #1359452");
                    uVar5 = 0x7d5;
                  }
                }
                else {
                  puts("Failed AD call for fix #1359452 out0[1] == -1");
                  uVar5 = 0x7d4;
                }
              }
              else {
                printf("Failed AD call for fix #1359452 [%d]\n");
                uVar5 = 0x7d3;
              }
            }
            else {
              puts("Failed AD call for fix #1359452 out0[0] == -1");
              uVar5 = 0x7d1;
            }
          }
          else {
            printf("Failed AD call for fix #1359452 [%d]\n");
            uVar5 = 2000;
          }
        }
      }
      else {
LAB_00119852:
        printf("Fail for output id=%d\n");
        uVar5 = (ulong)EVar4;
      }
    }
    else {
LAB_001197ef:
      uVar5 = (ulong)EVar4;
    }
LAB_001197f1:
    if ((ErrorNumber)uVar5 != TA_TEST_PASS) {
      printf("Failed Test #%d (Code=%d)\n",uVar10 & 0xffffffff,uVar5);
      return (ErrorNumber)uVar5;
    }
    uVar10 = uVar10 + 1;
    pTVar9 = pTVar9 + 1;
    if (uVar10 == 0x18) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_per_hlcv( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;


   for( i=0; i < NB_TEST; i++ )
   {
      /* Re-initialize all the unstable period to zero. */
      TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}